

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O3

Qiniu_Error Qiniu_Mac_Auth(void *self,Qiniu_Header **header,char *url,char *addition,size_t addlen)

{
  char **ppcVar1;
  char *addr;
  char *pcVar2;
  Qiniu_Header *pQVar3;
  char **ppcVar4;
  Qiniu_Error QVar5;
  uint digest_len;
  char *path;
  char *items [1];
  char digest [65];
  uint local_8c;
  char *local_88;
  char *local_80;
  char local_78 [72];
  
  local_8c = 0x41;
  QVar5 = Qiniu_Mac_Parse_Url(url,(char **)0x0,(size_t *)0x0,&local_88,(size_t *)addlen);
  if (QVar5.code == 200) {
    if (self == (void *)0x0) {
      ppcVar1 = &QINIU_SECRET_KEY;
      ppcVar4 = &QINIU_ACCESS_KEY;
    }
    else {
      ppcVar1 = (char **)((long)self + 8);
      ppcVar4 = (char **)self;
    }
    pcVar2 = *ppcVar4;
    local_80 = local_88;
    Qiniu_Mac_Hmac_inner((Qiniu_Mac *)*ppcVar1,&local_80,1,addition,addlen,local_78,&local_8c);
    addr = Qiniu_Memory_Encode(local_78,(ulong)local_8c);
    pcVar2 = Qiniu_String_Concat("Authorization: QBox ",pcVar2,":",addr,0);
    Qiniu_Free(addr);
    pQVar3 = (Qiniu_Header *)curl_slist_append(*header,pcVar2);
    *header = pQVar3;
    Qiniu_Free(pcVar2);
    QVar5._4_4_ = 0;
    QVar5.code = Qiniu_OK.code;
    QVar5.message = Qiniu_OK.message;
  }
  return QVar5;
}

Assistant:

static Qiniu_Error Qiniu_Mac_Auth(
	void *self, Qiniu_Header **header, const char *url, const char *addition, size_t addlen)
{
	Qiniu_Error err;
	char *auth;
	char *enc_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	unsigned int digest_len = sizeof(digest);
	Qiniu_Mac mac;

	char const *path;
	err = Qiniu_Mac_Parse_Url(url, NULL, NULL, &path, NULL);
	if (err.code != 200)
	{
		return err;
	}

	if (self)
	{
		mac = *(Qiniu_Mac *)self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}
	Qiniu_Mac_Hmac(&mac, path, addition, addlen, digest, &digest_len);
	enc_digest = Qiniu_Memory_Encode(digest, digest_len);

	auth = Qiniu_String_Concat("Authorization: QBox ", mac.accessKey, ":", enc_digest, NULL);
	Qiniu_Free(enc_digest);

	*header = curl_slist_append(*header, auth);
	Qiniu_Free(auth);

	return Qiniu_OK;
}